

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  ImGuiID IVar1;
  char *pcVar2;
  size_t sVar3;
  
  (this->ContentSizeIdeal).x = 0.0;
  (this->ContentSizeIdeal).y = 0.0;
  (this->ContentSizeExplicit).x = 0.0;
  (this->ContentSizeExplicit).y = 0.0;
  (this->SizeFull).x = 0.0;
  (this->SizeFull).y = 0.0;
  (this->ContentSize).x = 0.0;
  (this->ContentSize).y = 0.0;
  (this->Pos).x = 0.0;
  (this->Pos).y = 0.0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  (this->Scroll).x = 0.0;
  (this->Scroll).y = 0.0;
  (this->ScrollMax).x = 0.0;
  (this->ScrollMax).y = 0.0;
  (this->ScrollTarget).x = 0.0;
  (this->ScrollTarget).y = 0.0;
  (this->ScrollTargetCenterRatio).x = 0.0;
  (this->ScrollTargetCenterRatio).y = 0.0;
  (this->ScrollTargetEdgeSnapDist).x = 0.0;
  (this->ScrollTargetEdgeSnapDist).y = 0.0;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  (this->SetWindowPosVal).x = 0.0;
  (this->SetWindowPosVal).y = 0.0;
  (this->SetWindowPosPivot).x = 0.0;
  (this->SetWindowPosPivot).y = 0.0;
  (this->IDStack).Size = 0;
  (this->IDStack).Capacity = 0;
  (this->IDStack).Data = (uint *)0x0;
  ImGuiWindowTempData::ImGuiWindowTempData(&this->DC);
  memset(this,0,0x3e0);
  pcVar2 = ImStrdup(name);
  this->Name = pcVar2;
  sVar3 = strlen(name);
  this->NameBufLen = (int)sVar3 + 1;
  IVar1 = ImHashStr(name,0,0);
  this->ID = IVar1;
  ImVector<unsigned_int>::push_back(&this->IDStack,&this->ID);
  IVar1 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar1;
  (this->ScrollTarget).x = 3.4028235e+38;
  (this->ScrollTarget).y = 3.4028235e+38;
  (this->ScrollTargetCenterRatio).x = 0.5;
  (this->ScrollTargetCenterRatio).y = 0.5;
  this->AutoFitFramesX = -1;
  this->AutoFitFramesY = -1;
  this->AutoPosLastDirection = -1;
  *(uint *)&this->field_0xb4 = (uint)(byte)this->field_0xb7 << 0x18 | 0xf0f0f;
  (this->SetWindowPosVal).x = 3.4028235e+38;
  (this->SetWindowPosVal).y = 3.4028235e+38;
  (this->SetWindowPosPivot).x = 3.4028235e+38;
  (this->SetWindowPosPivot).y = 3.4028235e+38;
  this->LastFrameActive = -1;
  this->LastTimeActive = -1.0;
  this->FontWindowScale = 1.0;
  this->SettingsOffset = -1;
  this->DrawList = &this->DrawListInst;
  (this->DrawListInst)._Data = &context->DrawListSharedData;
  (this->DrawListInst)._OwnerName = this->Name;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name) : DrawListInst(NULL)
{
    memset(this, 0, sizeof(*this));
    Name = ImStrdup(name);
    NameBufLen = (int)strlen(name) + 1;
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    MoveId = GetID("#MOVE");
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoPosLastDirection = ImGuiDir_None;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);
    LastFrameActive = -1;
    LastTimeActive = -1.0f;
    FontWindowScale = 1.0f;
    SettingsOffset = -1;
    DrawList = &DrawListInst;
    DrawList->_Data = &context->DrawListSharedData;
    DrawList->_OwnerName = Name;
}